

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O2

ThreeAxisAngularAccelerometerSensor * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::operator=
          (ThreeAxisAngularAccelerometerSensor *this,ThreeAxisAngularAccelerometerSensor *other)

{
  if (this != other) {
    ThreeAxisAngularAccelerometerPrivateAttributes::operator=(this->pimpl,other->pimpl);
  }
  return this;
}

Assistant:

ThreeAxisAngularAccelerometerSensor& ThreeAxisAngularAccelerometerSensor::operator=(const ThreeAxisAngularAccelerometerSensor& other)
{
    if(this != &other)
    {
        *pimpl = *(other.pimpl);
    }
    return *this;
}